

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O1

int __thiscall
helics::CommsInterface::connect(CommsInterface *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  thread *ptVar1;
  char cVar2;
  native_handle_type nVar3;
  char cVar4;
  int iVar5;
  undefined7 uVar6;
  bool bVar7;
  string_view message;
  string_view message_00;
  string_view message_01;
  unique_lock<std::mutex> syncLock;
  unique_lock<std::mutex> local_48;
  anon_class_8_1_8991fb9c_for__M_head_impl local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  uVar6 = (undefined7)((ulong)this >> 8);
  if (((this->txStatus)._M_i == CONNECTED) && ((this->rxStatus)._M_i == CONNECTED)) {
    return (int)CONCAT71(uVar6,1);
  }
  if (((this->rxStatus)._M_i != STARTUP) || ((this->txStatus)._M_i != STARTUP)) {
    return 0;
  }
  if ((this->ActionCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
    message_00._M_str = "no callback specified, the receiver cannot start";
    message_00._M_len = 0x30;
    logError(this,message_00);
    return 0;
  }
  cVar4 = '\0';
  do {
    LOCK();
    cVar2 = (this->operating)._M_base._M_i;
    bVar7 = cVar4 == cVar2;
    if (bVar7) {
      (this->operating)._M_base._M_i = true;
      cVar2 = cVar4;
    }
    cVar4 = cVar2;
    UNLOCK();
    if (bVar7) goto LAB_002ecada;
  } while ((this->txStatus)._M_i == STARTUP);
  if (!bVar7) {
    if ((this->txStatus)._M_i != CONNECTED) {
      return 0;
    }
    return (int)CONCAT71(uVar6,(this->rxStatus)._M_i == CONNECTED);
  }
LAB_002ecada:
  local_48._M_device = &this->threadSyncLock;
  local_48._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_48);
  local_48._M_owns = true;
  if ((this->name)._M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->name,&this->localTargetAddress);
  }
  if ((this->localTargetAddress)._M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->localTargetAddress,&this->name);
  }
  if ((this->randomID)._M_string_length == 0) {
    gmlc::utilities::randomString_abi_cxx11_(0x2ecd53);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->randomID,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->singleThread == false) {
    local_38.this = this;
    std::thread::thread<helics::CommsInterface::connect()::__0,,void>((thread *)&local_30,&local_38)
    ;
    if ((this->queue_watcher)._M_id._M_thread != 0) goto LAB_002ecd8a;
    (this->queue_watcher)._M_id._M_thread = (native_handle_type)local_30._M_dataplus._M_p;
  }
  local_38.this = this;
  std::thread::thread<helics::CommsInterface::connect()::__1,,void>
            ((thread *)&local_30,(anon_class_8_1_8991fb9c_for__M_head_impl *)&local_38);
  if ((this->queue_transmitter)._M_id._M_thread != 0) {
LAB_002ecd8a:
    std::terminate();
  }
  ptVar1 = &this->queue_transmitter;
  (ptVar1->_M_id)._M_thread = (native_handle_type)local_30._M_dataplus._M_p;
  std::unique_lock<std::mutex>::unlock(&local_48);
  gmlc::concurrency::TriggerVariable::waitActivation(&this->txTrigger);
  gmlc::concurrency::TriggerVariable::waitActivation(&this->rxTrigger);
  if ((this->rxStatus)._M_i == CONNECTED) {
    if ((this->txStatus)._M_i == CONNECTED) {
      iVar5 = (int)CONCAT71(uVar6,1);
      goto LAB_002ecd18;
    }
    if (((this->requestDisconnect)._M_base._M_i & 1U) == 0) {
      message_01._M_str = "transmitter connection failure";
      message_01._M_len = 0x1e;
      logError(this,message_01);
    }
    if ((this->singleThread == false) && ((this->rxStatus)._M_i == CONNECTED)) {
      std::unique_lock<std::mutex>::lock(&local_48);
      if ((this->queue_watcher)._M_id._M_thread != 0) {
        std::unique_lock<std::mutex>::unlock(&local_48);
        (*this->_vptr_CommsInterface[7])(this);
        std::unique_lock<std::mutex>::lock(&local_48);
        if ((this->queue_watcher)._M_id._M_thread != 0) {
          std::thread::join();
        }
      }
      std::unique_lock<std::mutex>::unlock(&local_48);
    }
    std::unique_lock<std::mutex>::lock(&local_48);
    nVar3 = (ptVar1->_M_id)._M_thread;
joined_r0x002ecd0c:
    if (nVar3 != 0) {
      std::thread::join();
    }
  }
  else {
    if (((this->requestDisconnect)._M_base._M_i & 1U) == 0) {
      message._M_str = "receiver connection failure";
      message._M_len = 0x1b;
      logError(this,message);
    }
    if ((this->txStatus)._M_i == CONNECTED) {
      std::unique_lock<std::mutex>::lock(&local_48);
      if ((ptVar1->_M_id)._M_thread != 0) {
        std::unique_lock<std::mutex>::unlock(&local_48);
        (*this->_vptr_CommsInterface[6])(this);
        std::unique_lock<std::mutex>::lock(&local_48);
        if ((ptVar1->_M_id)._M_thread != 0) {
          std::thread::join();
        }
      }
      std::unique_lock<std::mutex>::unlock(&local_48);
    }
    if (this->singleThread == false) {
      std::unique_lock<std::mutex>::lock(&local_48);
      nVar3 = (this->queue_watcher)._M_id._M_thread;
      goto joined_r0x002ecd0c;
    }
  }
  iVar5 = 0;
LAB_002ecd18:
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  return iVar5;
}

Assistant:

bool CommsInterface::connect()
{
    if (isConnected()) {
        return true;
    }
    if (rxStatus != ConnectionStatus::STARTUP) {
        return false;
    }
    if (txStatus != ConnectionStatus::STARTUP) {
        return false;
    }
    // bool exp = false;
    if (!ActionCallback) {
        logError("no callback specified, the receiver cannot start");
        return false;
    }
    if (!propertyLock()) {
        // this will lock all the properties and should not be unlocked;
        return isConnected();
    }
    std::unique_lock<std::mutex> syncLock(threadSyncLock);
    if (name.empty()) {
        name = localTargetAddress;
    }
    if (localTargetAddress.empty()) {
        localTargetAddress = name;
    }
    if (randomID.empty()) {
        randomID = gmlc::utilities::randomString(10);
    }
    if (!singleThread) {
        queue_watcher = std::thread([this] {
            try {
                queue_rx_function();
            }
            catch (const std::exception& e) {
                rxStatus = ConnectionStatus::ERRORED;
                logError(std::string("error in receiver >") + e.what());
            }
        });
    }

    queue_transmitter = std::thread([this] {
        try {
            queue_tx_function();
        }
        catch (const std::exception& e) {
            txStatus = ConnectionStatus::ERRORED;
            logError(std::string("error in transmitter >") + e.what());
        }
    });
    syncLock.unlock();
    txTrigger.waitActivation();
    rxTrigger.waitActivation();
    if (rxStatus != ConnectionStatus::CONNECTED) {
        if (!requestDisconnect.load()) {
            logError("receiver connection failure");
        }

        if (txStatus == ConnectionStatus::CONNECTED) {
            syncLock.lock();
            if (queue_transmitter.joinable()) {
                syncLock.unlock();
                closeTransmitter();
                syncLock.lock();
                if (queue_transmitter.joinable()) {
                    queue_transmitter.join();
                }
            }
            syncLock.unlock();
        }
        if (!singleThread) {
            syncLock.lock();
            if (queue_watcher.joinable()) {
                queue_watcher.join();
            }
        }
        return false;
    }

    if (txStatus != ConnectionStatus::CONNECTED) {
        if (!requestDisconnect.load()) {
            logError("transmitter connection failure");
        }
        if (!singleThread) {
            if (rxStatus == ConnectionStatus::CONNECTED) {
                syncLock.lock();
                if (queue_watcher.joinable()) {
                    syncLock.unlock();
                    closeReceiver();
                    syncLock.lock();
                    if (queue_watcher.joinable()) {
                        queue_watcher.join();
                    }
                }
                syncLock.unlock();
            }
        }
        syncLock.lock();
        if (queue_transmitter.joinable()) {
            queue_transmitter.join();
        }
        return false;
    }
    return true;
}